

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.c
# Opt level: O3

_Bool player_stat_dec(player *p,wchar_t stat,_Bool permanent)

{
  ulong uVar1;
  short sVar2;
  ushort uVar3;
  player_upkeep *ppVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  
  sVar2 = p->stat_cur[stat];
  iVar7 = (int)sVar2;
  if (iVar7 < 0x1d) {
    iVar5 = 0x12;
    if (sVar2 < 0x13) {
      iVar5 = iVar7 - (uint)(3 < sVar2);
    }
  }
  else {
    iVar5 = iVar7 + -10;
  }
  uVar3 = p->stat_max[stat];
  uVar6 = (uint)uVar3;
  if (permanent) {
    if ((short)uVar3 < 0x1d) {
      uVar6 = 0x12;
      if ((short)uVar3 < 0x13) {
        uVar6 = (int)(short)uVar3 - (uint)(3 < (short)uVar3);
      }
      if (uVar6 == (int)(short)uVar3) {
        return false;
      }
    }
    else {
      uVar6 = uVar3 - 10;
    }
  }
  else if (iVar5 == iVar7) {
    return false;
  }
  p->stat_cur[stat] = (int16_t)iVar5;
  p->stat_max[stat] = (int16_t)uVar6;
  ppVar4 = p->upkeep;
  uVar1._0_4_ = ppVar4->update;
  uVar1._4_4_ = ppVar4->redraw;
  ppVar4->update = (int)(uVar1 | 0x1000000001);
  ppVar4->redraw = (int)((uVar1 | 0x1000000001) >> 0x20);
  return true;
}

Assistant:

bool player_stat_dec(struct player *p, int stat, bool permanent)
{
	int cur, max, res = false;

	cur = p->stat_cur[stat];
	max = p->stat_max[stat];

	if (cur > 18+10)
		cur -= 10;
	else if (cur > 18)
		cur = 18;
	else if (cur > 3)
		cur -= 1;

	res = (cur != p->stat_cur[stat]);

	if (permanent) {
		if (max > 18+10)
			max -= 10;
		else if (max > 18)
			max = 18;
		else if (max > 3)
			max -= 1;

		res = (max != p->stat_max[stat]);
	}

	if (res) {
		p->stat_cur[stat] = cur;
		p->stat_max[stat] = max;
		p->upkeep->update |= (PU_BONUS);
		p->upkeep->redraw |= (PR_STATS);
	}

	return res;
}